

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.cpp
# Opt level: O1

RPCHelpMan * submitpackage(void)

{
  size_type *psVar1;
  ulong *puVar2;
  long *plVar3;
  string name;
  string name_00;
  string name_01;
  string name_02;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string name_03;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string description_14;
  Fallback fallback;
  Fallback fallback_00;
  Fallback fallback_01;
  Fallback fallback_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_15;
  string description_16;
  string description_17;
  string description_18;
  vector<RPCArg,_std::allocator<RPCArg>_> inner_14;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  RPCArgOptions opts_01;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  long *plVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  undefined8 uVar14;
  RPCHelpMan *in_RDI;
  long lVar15;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  initializer_list<RPCResult> __l_05;
  initializer_list<RPCResult> __l_06;
  undefined4 in_stack_ffffffffffffe778;
  undefined4 uVar16;
  undefined4 in_stack_ffffffffffffe77c;
  undefined1 *puVar17;
  undefined4 uVar18;
  undefined1 in_stack_ffffffffffffe780 [16];
  undefined8 in_stack_ffffffffffffe798;
  undefined8 in_stack_ffffffffffffe7a0;
  undefined8 in_stack_ffffffffffffe7a8;
  code *pcVar19;
  undefined8 in_stack_ffffffffffffe7b0;
  undefined1 in_stack_ffffffffffffe7b8 [16];
  pointer in_stack_ffffffffffffe7c8;
  pointer pRVar20;
  pointer in_stack_ffffffffffffe7d0;
  pointer pRVar21;
  pointer in_stack_ffffffffffffe7d8;
  pointer pRVar22;
  pointer in_stack_ffffffffffffe7e0;
  undefined1 in_stack_ffffffffffffe7e8 [16];
  pointer in_stack_ffffffffffffe7f8;
  undefined8 in_stack_ffffffffffffe800;
  pointer in_stack_ffffffffffffe808;
  pointer in_stack_ffffffffffffe810;
  pointer in_stack_ffffffffffffe818;
  undefined8 in_stack_ffffffffffffe820;
  pointer in_stack_ffffffffffffe828;
  pointer in_stack_ffffffffffffe830;
  pointer in_stack_ffffffffffffe838;
  _Vector_impl_data in_stack_ffffffffffffe840;
  pointer in_stack_ffffffffffffe858;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1788;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1770;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1758;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1738;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1718;
  vector<RPCResult,_std::allocator<RPCResult>_> local_16f8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_16e0;
  vector<RPCResult,_std::allocator<RPCResult>_> local_16c8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_16a8;
  RPCResults local_1690;
  allocator_type local_1672;
  allocator_type local_1671;
  vector<RPCArg,_std::allocator<RPCArg>_> local_1670;
  vector<RPCArg,_std::allocator<RPCArg>_> local_1658;
  string local_1640;
  string local_1620;
  string local_1600;
  string local_15e0;
  string local_15c0;
  string local_15a0;
  ulong *local_1580;
  undefined8 local_1578;
  ulong local_1570;
  undefined8 uStack_1568;
  ulong *local_1560;
  size_type local_1558;
  ulong local_1550;
  undefined8 uStack_1548;
  long *local_1540 [2];
  long local_1530 [2];
  long *local_1520 [2];
  long local_1510 [2];
  RPCResult local_1500;
  long *local_1478 [2];
  long local_1468 [2];
  long *local_1458 [2];
  long local_1448 [2];
  long *local_1438 [2];
  long local_1428 [2];
  long *local_1418 [2];
  long local_1408 [2];
  long *local_13f8 [2];
  long local_13e8 [2];
  long *local_13d8 [2];
  long local_13c8 [2];
  RPCResult local_13b8;
  long *local_1330 [2];
  long local_1320 [2];
  long *local_1310 [2];
  long local_1300 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12f0;
  size_type *local_12d0;
  size_type local_12c8;
  size_type local_12c0 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_12b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1290;
  pointer local_1270 [2];
  undefined1 local_1260 [152];
  RPCResult local_11c8;
  RPCResult local_1140;
  long *local_10b8 [2];
  long local_10a8 [2];
  long *local_1098 [2];
  long local_1088 [2];
  long *local_1078 [2];
  long local_1068 [2];
  long *local_1058 [2];
  long local_1048 [2];
  long *local_1038 [2];
  long local_1028 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_1018;
  long *local_ff8 [2];
  long local_fe8 [2];
  pointer local_fd8 [2];
  undefined1 local_fc8 [152];
  RPCResult local_f30;
  RPCResult local_ea8;
  RPCResult local_e20;
  RPCResult local_d98;
  long *local_d10 [2];
  long local_d00 [2];
  long *local_cf0 [2];
  long local_ce0 [2];
  RPCResult local_cd0;
  long *local_c48 [2];
  long local_c38 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_c28;
  long *local_c08 [2];
  long local_bf8 [2];
  pointer local_be8 [2];
  undefined1 local_bd8 [152];
  RPCResult local_b40;
  RPCResult local_ab8;
  long *local_a30 [2];
  long local_a20 [2];
  long *local_a10 [2];
  long local_a00 [2];
  RPCResult local_9f0;
  undefined1 local_968;
  undefined1 *local_960;
  undefined8 local_958;
  undefined1 local_950;
  undefined7 uStack_94f;
  undefined1 local_940 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_920;
  size_type *local_900;
  size_type local_8f8;
  size_type local_8f0;
  undefined8 uStack_8e8;
  string local_8e0;
  UniValue local_8c0;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_868;
  undefined1 local_810;
  long *local_808 [2];
  long local_7f8 [2];
  undefined1 local_7e8;
  undefined1 *local_7e0;
  undefined8 local_7d8;
  undefined1 local_7d0;
  undefined7 uStack_7cf;
  undefined1 local_7c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0;
  size_type *local_780;
  size_type local_778;
  size_type local_770;
  undefined8 uStack_768;
  string local_760;
  UniValue local_740;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_6e8;
  undefined1 local_690;
  long *local_688 [2];
  long local_678 [2];
  undefined1 local_668 [8];
  undefined1 *local_660;
  undefined8 local_658;
  undefined1 local_650;
  undefined7 uStack_64f;
  undefined1 local_640 [32];
  undefined1 local_620;
  undefined1 *local_618;
  undefined8 local_610;
  undefined1 local_608;
  undefined7 uStack_607;
  undefined1 local_5f8 [32];
  long *local_5d8 [2];
  long local_5c8 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_5b8;
  undefined1 local_560;
  long *local_558 [2];
  long local_548 [2];
  undefined1 local_538 [216];
  undefined1 local_460 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_450;
  long *local_430 [2];
  long local_420 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_410;
  undefined1 local_3b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b0;
  RPCArg local_390;
  RPCArg local_288;
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_1038[1] = (long *)0x0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"submitpackage","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "Submit a package of raw transactions (serialized, hex-encoded) to local node.\nThe package will be validated according to consensus and mempool policy rules. If any transaction passes, it will be accepted to mempool.\nThis RPC is experimental and the interface may be unstable. Refer to doc/policy/packages.md for documentation on package policies.\nWarning: successful submission does not mean the transactions will propagate throughout the network.\n"
             ,"");
  local_3b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_3b0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"package","");
  local_410._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_3b8 = 0;
  local_430[0] = local_420;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_430,
             "An array of raw transactions.\nThe package must solely consist of a child and its parents. None of the parents may depend on each other.\nThe package must be topologically sorted, with the child being the last element in the array."
             ,"");
  local_558[0] = local_548;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_558,"rawtx","");
  local_5b8._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_560 = 0;
  local_5d8[0] = local_5c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5d8,"");
  local_618 = &local_608;
  local_620 = 0;
  local_610 = 0;
  local_608 = 0;
  local_5f8._0_8_ = (pointer)0x0;
  local_5f8._8_2_ = 0;
  local_5f8._10_6_ = 0;
  local_5f8._16_2_ = 0;
  local_5f8._18_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe77c;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe778;
  name._8_16_ = in_stack_ffffffffffffe780;
  name.field_2._8_8_ = in_RDI;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe7a0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe798;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe7a8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe7b0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe7b8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe7c8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe7d0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe7d8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe7e0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffe7e8;
  description_15._M_string_length = in_stack_ffffffffffffe800;
  description_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe7f8;
  description_15.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe808;
  description_15.field_2._8_8_ = in_stack_ffffffffffffe810;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe820;
  opts._0_8_ = in_stack_ffffffffffffe818;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe828;
  opts.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe830;
  opts.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe838;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_ffffffffffffe840;
  opts._64_8_ = in_stack_ffffffffffffe858;
  RPCArg::RPCArg((RPCArg *)local_538,name,(Type)local_558,fallback,description_15,opts);
  __l._M_len = 1;
  __l._M_array = (iterator)local_538;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_1670,__l,&local_1671);
  local_660 = &local_650;
  local_668[0] = 0;
  local_658 = 0;
  local_650 = 0;
  local_640._0_8_ = (pointer)0x0;
  local_640._8_2_ = 0;
  local_640._10_6_ = 0;
  local_640._16_2_ = 0;
  local_640._18_8_ = 0;
  puVar17 = local_668;
  name_00._8_16_ = in_stack_ffffffffffffe780;
  name_00._M_dataplus._M_p = puVar17;
  name_00.field_2._8_8_ = in_RDI;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe7a0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe798;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe7a8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe7b0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe7b8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe7c8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe7d0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe7d8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe7e0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffe7e8;
  description_16._M_string_length = in_stack_ffffffffffffe800;
  description_16._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe7f8;
  description_16.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe808;
  description_16.field_2._8_8_ = in_stack_ffffffffffffe810;
  inner_14.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffe820;
  inner_14.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffe818;
  inner_14.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffe828;
  RPCArg::RPCArg(&local_390,name_00,(Type)&local_3b0,fallback_00,description_16,inner_14,
                 (RPCArgOptions *)0x1);
  local_688[0] = local_678;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"maxfeerate","");
  FormatMoney_abi_cxx11_(&local_760,node::DEFAULT_MAX_RAW_TX_FEE_RATE);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_740,&local_760);
  paVar13 = &local_740.val.field_2;
  local_6e8._8_8_ = (long)&local_6e8 + 0x18;
  local_6e8._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_740.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_740.val._M_dataplus._M_p == paVar13) {
    local_6e8._32_8_ = local_740.val.field_2._8_8_;
  }
  else {
    local_6e8._8_8_ = local_740.val._M_dataplus._M_p;
  }
  local_6e8._16_8_ = local_740.val._M_string_length;
  local_740.val._M_string_length = 0;
  local_740.val.field_2._M_local_buf[0] = '\0';
  local_6e8._40_8_ =
       local_740.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_6e8._48_8_ =
       local_740.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_6e8._56_8_ =
       local_740.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_740.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_740.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_740.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6e8._64_8_ =
       local_740.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_6e8._72_8_ =
       local_740.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_6e8._80_8_ =
       local_740.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_740.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_740.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_740.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_690 = 2;
  local_740.val._M_dataplus._M_p = (pointer)paVar13;
  std::operator+(&local_7a0,
                 "Reject transactions whose fee rate is higher than the specified value, expressed in "
                 ,&CURRENCY_UNIT_abi_cxx11_);
  pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_7a0,
                       "/kvB.\nFee rates larger than 1BTC/kvB are rejected.\nSet to 0 to accept any fee rate."
                      );
  local_780 = &local_770;
  psVar1 = (size_type *)(pbVar11->_M_dataplus)._M_p;
  paVar13 = &pbVar11->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar13) {
    local_770 = paVar13->_M_allocated_capacity;
    uStack_768 = *(undefined8 *)((long)&pbVar11->field_2 + 8);
  }
  else {
    local_770 = paVar13->_M_allocated_capacity;
    local_780 = psVar1;
  }
  local_778 = pbVar11->_M_string_length;
  (pbVar11->_M_dataplus)._M_p = (pointer)paVar13;
  pbVar11->_M_string_length = 0;
  (pbVar11->field_2)._M_local_buf[0] = '\0';
  local_7e0 = &local_7d0;
  local_7e8 = 0;
  local_7d8 = 0;
  local_7d0 = 0;
  local_7c0._0_8_ = (pointer)0x0;
  local_7c0._8_2_ = 0;
  local_7c0._10_6_ = 0;
  local_7c0._16_2_ = 0;
  local_7c0._18_8_ = 0;
  name_01._8_16_ = in_stack_ffffffffffffe780;
  name_01._M_dataplus._M_p = puVar17;
  name_01.field_2._8_8_ = in_RDI;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe7a0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe798;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe7a8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe7b0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe7b8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe7c8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe7d0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe7d8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe7e0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffe7e8;
  description_17._M_string_length = in_stack_ffffffffffffe800;
  description_17._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe7f8;
  description_17.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe808;
  description_17.field_2._8_8_ = in_stack_ffffffffffffe810;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe820;
  opts_00._0_8_ = in_stack_ffffffffffffe818;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe828;
  opts_00.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe830;
  opts_00.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe838;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_ffffffffffffe840;
  opts_00._64_8_ = in_stack_ffffffffffffe858;
  RPCArg::RPCArg(&local_288,name_01,(Type)local_688,fallback_01,description_17,opts_00);
  local_808[0] = local_7f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_808,"maxburnamount","");
  FormatMoney_abi_cxx11_(&local_8e0,0);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_8c0,&local_8e0);
  paVar13 = &local_8c0.val.field_2;
  local_868._8_8_ = (long)&local_868 + 0x18;
  local_868._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_8c0.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c0.val._M_dataplus._M_p == paVar13) {
    local_868._32_8_ = local_8c0.val.field_2._8_8_;
  }
  else {
    local_868._8_8_ = local_8c0.val._M_dataplus._M_p;
  }
  local_868._16_8_ = local_8c0.val._M_string_length;
  local_8c0.val._M_string_length = 0;
  local_8c0.val.field_2._M_local_buf[0] = '\0';
  local_868._40_8_ =
       local_8c0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_868._48_8_ =
       local_8c0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_868._56_8_ =
       local_8c0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_8c0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_8c0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8c0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_868._64_8_ =
       local_8c0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_868._72_8_ =
       local_8c0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_868._80_8_ =
       local_8c0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_8c0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_8c0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8c0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_810 = 2;
  local_8c0.val._M_dataplus._M_p = (pointer)paVar13;
  std::operator+(&local_920,
                 "Reject transactions with provably unspendable outputs (e.g. \'datacarrier\' outputs that use the OP_RETURN opcode) greater than the specified value, expressed in "
                 ,&CURRENCY_UNIT_abi_cxx11_);
  pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_920,
                       ".\nIf burning funds through unspendable outputs is desired, increase this value.\nThis check is based on heuristics and does not guarantee spendability of outputs.\n"
                      );
  local_900 = &local_8f0;
  psVar1 = (size_type *)(pbVar11->_M_dataplus)._M_p;
  paVar13 = &pbVar11->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar13) {
    local_8f0 = paVar13->_M_allocated_capacity;
    uStack_8e8 = *(undefined8 *)((long)&pbVar11->field_2 + 8);
  }
  else {
    local_8f0 = paVar13->_M_allocated_capacity;
    local_900 = psVar1;
  }
  local_8f8 = pbVar11->_M_string_length;
  (pbVar11->_M_dataplus)._M_p = (pointer)paVar13;
  pbVar11->_M_string_length = 0;
  (pbVar11->field_2)._M_local_buf[0] = '\0';
  local_960 = &local_950;
  local_968 = 0;
  local_958 = 0;
  local_950 = 0;
  local_940._0_8_ = (pointer)0x0;
  local_940._8_2_ = 0;
  local_940._10_6_ = 0;
  local_940._16_2_ = 0;
  local_940._18_8_ = 0;
  name_02._8_16_ = in_stack_ffffffffffffe780;
  name_02._M_dataplus._M_p = puVar17;
  name_02.field_2._8_8_ = in_RDI;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe7a0;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe798;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe7a8;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe7b0;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe7b8;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe7c8;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe7d0;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe7d8;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe7e0;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffe7e8;
  description_18._M_string_length = in_stack_ffffffffffffe800;
  description_18._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe7f8;
  description_18.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe808;
  description_18.field_2._8_8_ = in_stack_ffffffffffffe810;
  opts_01.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe820;
  opts_01._0_8_ = in_stack_ffffffffffffe818;
  opts_01.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe828;
  opts_01.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe830;
  opts_01.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe838;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_ffffffffffffe840;
  opts_01._64_8_ = in_stack_ffffffffffffe858;
  RPCArg::RPCArg(&local_180,name_02,(Type)local_808,fallback_02,description_18,opts_01);
  __l_00._M_len = 3;
  __l_00._M_array = &local_390;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_1658,__l_00,&local_1672);
  local_a10[0] = local_a00;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a10,"");
  local_a30[0] = local_a20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a30,"");
  local_be8[0] = (pointer)local_bd8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_be8,"package_msg","");
  local_c08[0] = local_bf8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c08,
             "The transaction package result message. \"success\" indicates all transactions were accepted into or are already in the mempool."
             ,"");
  local_16c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_16c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_16c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._8_16_ = in_stack_ffffffffffffe780;
  m_key_name._M_dataplus._M_p = puVar17;
  m_key_name.field_2._8_8_ = in_RDI;
  description._M_string_length = in_stack_ffffffffffffe7a0;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe798;
  description.field_2._M_allocated_capacity = in_stack_ffffffffffffe7a8;
  description.field_2._8_8_ = in_stack_ffffffffffffe7b0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffe7c8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffe7b8._0_8_;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffe7b8._8_8_;
  RPCResult::RPCResult
            ((RPCResult *)(local_bd8 + 0x10),STR,m_key_name,description,inner,SUB81(local_be8,0));
  local_c28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_c28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c28,"tx-results","");
  local_c48[0] = local_c38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c48,"transaction results keyed by wtxid","");
  local_cf0[0] = local_ce0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cf0,"wtxid","");
  local_d10[0] = local_d00;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d10,"transaction wtxid","");
  local_fd8[0] = (pointer)local_fc8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_fd8,"txid","");
  local_ff8[0] = local_fe8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ff8,"The transaction hash in hex","");
  local_1718.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1718.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1718.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._8_16_ = in_stack_ffffffffffffe780;
  m_key_name_00._M_dataplus._M_p = puVar17;
  m_key_name_00.field_2._8_8_ = in_RDI;
  description_00._M_string_length = in_stack_ffffffffffffe7a0;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe798;
  description_00.field_2._M_allocated_capacity = in_stack_ffffffffffffe7a8;
  description_00.field_2._8_8_ = in_stack_ffffffffffffe7b0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe7c8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe7b8._0_8_;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe7b8._8_8_;
  RPCResult::RPCResult
            ((RPCResult *)(local_fc8 + 0x10),STR_HEX,m_key_name_00,description_00,inner_00,
             SUB81(local_fd8,0));
  local_1018.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_1018.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1018,"other-wtxid","");
  uVar18 = (undefined4)((ulong)puVar17 >> 0x20);
  local_1038[0] = local_1028;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1038,
             "The wtxid of a different transaction with the same txid but different witness found in the mempool. This means the submitted transaction was ignored."
             ,"");
  local_1738.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1738.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1738.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar4._4_16_ = in_stack_ffffffffffffe780;
  auVar4._0_4_ = uVar18;
  auVar4._20_8_ = in_RDI;
  auVar4._28_4_ = 0;
  description_01._M_string_length = in_stack_ffffffffffffe7a0;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe798;
  description_01.field_2._M_allocated_capacity = in_stack_ffffffffffffe7a8;
  description_01.field_2._8_8_ = in_stack_ffffffffffffe7b0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe7c8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe7b8._0_8_;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe7b8._8_8_;
  RPCResult::RPCResult
            (&local_f30,STR_HEX,(string)(auVar4 << 0x20),SUB81(&local_1018,0),description_01,
             inner_01,true);
  local_1058[0] = local_1048;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1058,"vsize","");
  local_1078[0] = local_1068;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1078,"Sigops-adjusted virtual transaction size.","");
  local_1758.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1758.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1758.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar16 = 0;
  auVar5._4_16_ = in_stack_ffffffffffffe780;
  auVar5._0_4_ = uVar18;
  auVar5._20_8_ = in_RDI;
  auVar5._28_4_ = 0;
  description_02._M_string_length = in_stack_ffffffffffffe7a0;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe798;
  description_02.field_2._M_allocated_capacity = in_stack_ffffffffffffe7a8;
  description_02.field_2._8_8_ = in_stack_ffffffffffffe7b0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe7c8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe7b8._0_8_;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe7b8._8_8_;
  RPCResult::RPCResult
            (&local_ea8,NUM,(string)(auVar5 << 0x20),SUB81(local_1058,0),description_02,inner_02,
             true);
  local_1098[0] = local_1088;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1098,"fees","");
  local_10b8[0] = local_10a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_10b8,"Transaction fees","");
  local_1270[0] = (pointer)local_1260;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1270,"base","");
  std::operator+(&local_1290,"transaction fee in ",&CURRENCY_UNIT_abi_cxx11_);
  local_1788.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1788.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1788.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = uVar18;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar16;
  m_key_name_01._8_16_ = in_stack_ffffffffffffe780;
  m_key_name_01.field_2._8_8_ = in_RDI;
  description_03._M_string_length = in_stack_ffffffffffffe7a0;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe798;
  description_03.field_2._M_allocated_capacity = in_stack_ffffffffffffe7a8;
  description_03.field_2._8_8_ = in_stack_ffffffffffffe7b0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe7c8;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe7b8._0_8_;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe7b8._8_8_;
  RPCResult::RPCResult
            ((RPCResult *)(local_1260 + 0x10),STR_AMOUNT,m_key_name_01,description_03,inner_03,
             SUB81(local_1270,0));
  local_12b0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_12b0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12b0,"effective-feerate","");
  std::operator+(&local_12f0,
                 "if the transaction was not already in the mempool, the effective feerate in ",
                 &CURRENCY_UNIT_abi_cxx11_);
  pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_12f0,
                       " per KvB. For example, the package feerate and/or feerate with modified fees from prioritisetransaction."
                      );
  local_12d0 = local_12c0;
  psVar1 = (size_type *)(pbVar11->_M_dataplus)._M_p;
  paVar13 = &pbVar11->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar13) {
    local_12c0[0] = paVar13->_M_allocated_capacity;
    local_12c0[1] = *(undefined8 *)((long)&pbVar11->field_2 + 8);
  }
  else {
    local_12c0[0] = paVar13->_M_allocated_capacity;
    local_12d0 = psVar1;
  }
  local_12c8 = pbVar11->_M_string_length;
  (pbVar11->_M_dataplus)._M_p = (pointer)paVar13;
  pbVar11->_M_string_length = 0;
  (pbVar11->field_2)._M_local_buf[0] = '\0';
  uVar16 = 0;
  auVar6._4_16_ = in_stack_ffffffffffffe780;
  auVar6._0_4_ = uVar18;
  auVar6._20_8_ = in_RDI;
  auVar6._28_4_ = 0;
  description_04._M_string_length = in_stack_ffffffffffffe7a0;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe798;
  description_04.field_2._M_allocated_capacity = in_stack_ffffffffffffe7a8;
  description_04.field_2._8_8_ = in_stack_ffffffffffffe7b0;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe7c8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe7b8._0_8_;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe7b8._8_8_;
  RPCResult::RPCResult
            (&local_11c8,STR_AMOUNT,(string)(auVar6 << 0x20),SUB81(&local_12b0,0),description_04,
             inner_04,true);
  local_1310[0] = local_1300;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1310,"effective-includes","");
  local_1330[0] = local_1320;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1330,
             "if effective-feerate is provided, the wtxids of the transactions whose fees and vsizes are included in effective-feerate."
             ,"");
  local_13d8[0] = local_13c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13d8,"");
  local_13f8[0] = local_13e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_13f8,"transaction wtxid in hex","");
  m_key_name_02._M_dataplus._M_p._4_4_ = uVar18;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar16;
  m_key_name_02._8_16_ = in_stack_ffffffffffffe780;
  m_key_name_02.field_2._8_8_ = in_RDI;
  description_05._M_string_length = in_stack_ffffffffffffe7a0;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe798;
  description_05.field_2._M_allocated_capacity = in_stack_ffffffffffffe7a8;
  description_05.field_2._8_8_ = in_stack_ffffffffffffe7b0;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe7c8;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe7b8._0_8_;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe7b8._8_8_;
  RPCResult::RPCResult
            (&local_13b8,STR_HEX,m_key_name_02,description_05,inner_05,SUB81(local_13d8,0));
  __l_01._M_len = 1;
  __l_01._M_array = &local_13b8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe840,__l_01,
             (allocator_type *)&stack0xffffffffffffe827);
  auVar7._4_16_ = in_stack_ffffffffffffe780;
  auVar7._0_4_ = uVar18;
  auVar7._20_8_ = in_RDI;
  auVar7._28_4_ = 0;
  description_06._M_string_length = in_stack_ffffffffffffe7a0;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe798;
  description_06.field_2._M_allocated_capacity = in_stack_ffffffffffffe7a8;
  description_06.field_2._8_8_ = in_stack_ffffffffffffe7b0;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe7c8;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe7b8._0_8_;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe7b8._8_8_;
  RPCResult::RPCResult
            (&local_1140,ARR,(string)(auVar7 << 0x20),SUB81(local_1310,0),description_06,inner_06,
             true);
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)(local_1260 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1770,__l_02,(allocator_type *)&stack0xffffffffffffe826);
  auVar8._4_16_ = in_stack_ffffffffffffe780;
  auVar8._0_4_ = uVar18;
  auVar8._20_8_ = in_RDI;
  auVar8._28_4_ = 0;
  description_07._M_string_length = in_stack_ffffffffffffe7a0;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe798;
  description_07.field_2._M_allocated_capacity = in_stack_ffffffffffffe7a8;
  description_07.field_2._8_8_ = in_stack_ffffffffffffe7b0;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe7c8;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe7b8._0_8_;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe7b8._8_8_;
  RPCResult::RPCResult
            (&local_e20,OBJ,(string)(auVar8 << 0x20),SUB81(local_1098,0),description_07,inner_07,
             true);
  local_1418[0] = local_1408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1418,"error","");
  local_1438[0] = local_1428;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1438,"The transaction error string, if it was rejected by the mempool",
             "");
  uVar16 = 0;
  auVar9._4_16_ = in_stack_ffffffffffffe780;
  auVar9._0_4_ = uVar18;
  auVar9._20_8_ = in_RDI;
  auVar9._28_4_ = 0;
  description_08._M_string_length = in_stack_ffffffffffffe7a0;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe798;
  description_08.field_2._M_allocated_capacity = in_stack_ffffffffffffe7a8;
  description_08.field_2._8_8_ = in_stack_ffffffffffffe7b0;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe7c8;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe7b8._0_8_;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe7b8._8_8_;
  RPCResult::RPCResult
            (&local_d98,STR,(string)(auVar9 << 0x20),SUB81(local_1418,0),description_08,inner_08,
             true);
  __l_03._M_len = 5;
  __l_03._M_array = (iterator)(local_fc8 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_16f8,__l_03,(allocator_type *)&stack0xffffffffffffe807);
  m_key_name_03._M_dataplus._M_p._4_4_ = uVar18;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar16;
  m_key_name_03._8_16_ = in_stack_ffffffffffffe780;
  m_key_name_03.field_2._8_8_ = in_RDI;
  description_09._M_string_length = in_stack_ffffffffffffe7a0;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe798;
  description_09.field_2._M_allocated_capacity = in_stack_ffffffffffffe7a8;
  description_09.field_2._8_8_ = in_stack_ffffffffffffe7b0;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe7c8;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe7b8._0_8_;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe7b8._8_8_;
  RPCResult::RPCResult(&local_cd0,OBJ,m_key_name_03,description_09,inner_09,SUB81(local_cf0,0));
  __l_04._M_len = 1;
  __l_04._M_array = &local_cd0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_16e0,__l_04,(allocator_type *)&stack0xffffffffffffe806);
  m_key_name_04._M_dataplus._M_p._4_4_ = uVar18;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar16;
  m_key_name_04._8_16_ = in_stack_ffffffffffffe780;
  m_key_name_04.field_2._8_8_ = in_RDI;
  description_10._M_string_length = in_stack_ffffffffffffe7a0;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe798;
  description_10.field_2._M_allocated_capacity = in_stack_ffffffffffffe7a8;
  description_10.field_2._8_8_ = in_stack_ffffffffffffe7b0;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe7c8;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe7b8._0_8_;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe7b8._8_8_;
  RPCResult::RPCResult(&local_b40,OBJ_DYN,m_key_name_04,description_10,inner_10,SUB81(&local_c28,0))
  ;
  local_1458[0] = local_1448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1458,"replaced-transactions","");
  local_1478[0] = local_1468;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1478,"List of txids of replaced transactions","");
  local_1520[0] = local_1510;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1520,"");
  local_1540[0] = local_1530;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1540,"The transaction id","");
  pRVar20 = (pointer)0x0;
  pRVar21 = (pointer)0x0;
  pRVar22 = (pointer)0x0;
  m_key_name_05._M_dataplus._M_p._4_4_ = uVar18;
  m_key_name_05._M_dataplus._M_p._0_4_ = uVar16;
  m_key_name_05._8_16_ = in_stack_ffffffffffffe780;
  m_key_name_05.field_2._8_8_ = in_RDI;
  description_11._M_string_length = in_stack_ffffffffffffe7a0;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe798;
  description_11.field_2._M_allocated_capacity = in_stack_ffffffffffffe7a8;
  description_11.field_2._8_8_ = in_stack_ffffffffffffe7b0;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe7b8._0_8_;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe7b8._8_8_;
  RPCResult::RPCResult
            (&local_1500,STR_HEX,m_key_name_05,description_11,inner_11,SUB81(local_1520,0));
  __l_05._M_len = 1;
  __l_05._M_array = &local_1500;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe7e8,__l_05,
             (allocator_type *)&stack0xffffffffffffe7c7);
  uVar16 = 0;
  auVar10._4_16_ = in_stack_ffffffffffffe780;
  auVar10._0_4_ = uVar18;
  auVar10._20_8_ = in_RDI;
  auVar10._28_4_ = 0;
  description_12._M_string_length = in_stack_ffffffffffffe7a0;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe798;
  description_12.field_2._M_allocated_capacity = in_stack_ffffffffffffe7a8;
  description_12.field_2._8_8_ = in_stack_ffffffffffffe7b0;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar20;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe7b8._0_8_;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe7b8._8_8_;
  RPCResult::RPCResult
            (&local_ab8,ARR,(string)(auVar10 << 0x20),SUB81(local_1458,0),description_12,inner_12,
             true);
  __l_06._M_len = 3;
  __l_06._M_array = (iterator)(local_bd8 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_16a8,__l_06,(allocator_type *)&stack0xffffffffffffe7c6);
  m_key_name_06._M_dataplus._M_p._4_4_ = uVar18;
  m_key_name_06._M_dataplus._M_p._0_4_ = uVar16;
  m_key_name_06._8_16_ = in_stack_ffffffffffffe780;
  m_key_name_06.field_2._8_8_ = in_RDI;
  description_13._M_string_length = in_stack_ffffffffffffe7a0;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe798;
  description_13.field_2._M_allocated_capacity = in_stack_ffffffffffffe7a8;
  description_13.field_2._8_8_ = in_stack_ffffffffffffe7b0;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar20;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe7b8._0_8_;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe7b8._8_8_;
  RPCResult::RPCResult(&local_9f0,OBJ,m_key_name_06,description_13,inner_13,SUB81(local_a10,0));
  result._4_4_ = uVar18;
  result.m_type = uVar16;
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe780._0_8_;
  result.m_key_name._M_string_length = in_stack_ffffffffffffe780._8_8_;
  result.m_key_name.field_2._M_allocated_capacity = (size_type)in_RDI;
  result.m_key_name.field_2._8_8_ = in_stack_ffffffffffffe798;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe7a0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe7a8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe7b0;
  result.m_optional = (bool)in_stack_ffffffffffffe7b8[0];
  result.m_skip_type_check = (bool)in_stack_ffffffffffffe7b8[1];
  result._66_6_ = in_stack_ffffffffffffe7b8._2_6_;
  result.m_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe7b8._8_8_;
  result.m_description._M_string_length = (size_type)pRVar20;
  result.m_description.field_2._M_allocated_capacity = (size_type)pRVar21;
  result.m_description.field_2._8_8_ = pRVar22;
  result.m_cond._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe7e0;
  result.m_cond._8_16_ = in_stack_ffffffffffffe7e8;
  result.m_cond.field_2._8_8_ = in_stack_ffffffffffffe7f8;
  RPCResults::RPCResults(&local_1690,result);
  local_15c0._M_dataplus._M_p = (pointer)&local_15c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_15c0,"submitpackage","");
  local_15e0._M_dataplus._M_p = (pointer)&local_15e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_15e0,"[\"rawtx1\", \"rawtx2\"]","");
  HelpExampleRpc(&local_15a0,&local_15c0,&local_15e0);
  local_1620._M_dataplus._M_p = (pointer)&local_1620.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1620,"submitpackage","");
  local_1640._M_dataplus._M_p = (pointer)&local_1640.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1640,"\'[\"rawtx1\", \"rawtx2\"]\'","");
  HelpExampleCli(&local_1600,&local_1620,&local_1640);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15a0._M_dataplus._M_p != &local_15a0.field_2) {
    uVar14 = local_15a0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_1600._M_string_length + local_15a0._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1600._M_dataplus._M_p != &local_1600.field_2) {
      uVar14 = local_1600.field_2._M_allocated_capacity;
    }
    if (local_1600._M_string_length + local_15a0._M_string_length <= (ulong)uVar14) {
      pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                replace(&local_1600,0,0,local_15a0._M_dataplus._M_p,local_15a0._M_string_length);
      goto LAB_00309fb1;
    }
  }
  pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&local_15a0,local_1600._M_dataplus._M_p,local_1600._M_string_length);
LAB_00309fb1:
  local_1580 = &local_1570;
  puVar2 = (ulong *)(pbVar11->_M_dataplus)._M_p;
  paVar13 = &pbVar11->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar13) {
    local_1570 = paVar13->_M_allocated_capacity;
    uStack_1568 = *(undefined8 *)((long)&pbVar11->field_2 + 8);
  }
  else {
    local_1570 = paVar13->_M_allocated_capacity;
    local_1580 = puVar2;
  }
  local_1558 = pbVar11->_M_string_length;
  (pbVar11->_M_dataplus)._M_p = (pointer)paVar13;
  pbVar11->_M_string_length = 0;
  paVar13->_M_local_buf[0] = '\0';
  if (local_1580 == &local_1570) {
    uStack_1548 = uStack_1568;
    local_1560 = &local_1550;
  }
  else {
    local_1560 = local_1580;
  }
  local_1550 = local_1570;
  local_1578 = 0;
  local_1570 = local_1570 & 0xffffffffffffff00;
  pcVar19 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/mempool.cpp:870:9)>
            ::_M_manager;
  name_03._8_16_ = in_stack_ffffffffffffe780;
  name_03._M_dataplus._M_p = &stack0xffffffffffffe798;
  name_03.field_2._8_8_ = in_RDI;
  description_14.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/mempool.cpp:870:9)>
       ::_M_manager;
  description_14._M_dataplus._M_p = (pointer)0x0;
  description_14._M_string_length = 0;
  description_14.field_2._8_8_ =
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/mempool.cpp:870:9)>
       ::_M_invoke;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar20;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)in_stack_ffffffffffffe7b8._0_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_ffffffffffffe7b8._8_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar22;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = pRVar21;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffe7e0;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe7f8;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe7e8._0_8_;
  examples.m_examples._M_string_length = in_stack_ffffffffffffe7e8._8_8_;
  examples.m_examples.field_2._8_8_ = in_stack_ffffffffffffe800;
  local_1580 = &local_1570;
  RPCHelpMan::RPCHelpMan
            (in_RDI,name_03,description_14,args,results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar19 != (code *)0x0) {
    (*pcVar19)(&stack0xffffffffffffe798,&stack0xffffffffffffe798,3);
  }
  if (local_1560 != &local_1550) {
    operator_delete(local_1560,local_1550 + 1);
  }
  if (local_1580 != &local_1570) {
    operator_delete(local_1580,local_1570 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1600._M_dataplus._M_p != &local_1600.field_2) {
    operator_delete(local_1600._M_dataplus._M_p,local_1600.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1640._M_dataplus._M_p != &local_1640.field_2) {
    operator_delete(local_1640._M_dataplus._M_p,local_1640.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1620._M_dataplus._M_p != &local_1620.field_2) {
    operator_delete(local_1620._M_dataplus._M_p,local_1620.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15a0._M_dataplus._M_p != &local_15a0.field_2) {
    operator_delete(local_15a0._M_dataplus._M_p,local_15a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15e0._M_dataplus._M_p != &local_15e0.field_2) {
    operator_delete(local_15e0._M_dataplus._M_p,local_15e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15c0._M_dataplus._M_p != &local_15c0.field_2) {
    operator_delete(local_15c0._M_dataplus._M_p,local_15c0.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1690.m_results);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0.m_cond._M_dataplus._M_p != &local_9f0.m_cond.field_2) {
    operator_delete(local_9f0.m_cond._M_dataplus._M_p,
                    local_9f0.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0.m_description._M_dataplus._M_p != &local_9f0.m_description.field_2) {
    operator_delete(local_9f0.m_description._M_dataplus._M_p,
                    local_9f0.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_9f0.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0.m_key_name._M_dataplus._M_p != &local_9f0.m_key_name.field_2) {
    operator_delete(local_9f0.m_key_name._M_dataplus._M_p,
                    local_9f0.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_16a8);
  lVar15 = 0x198;
  do {
    if ((long *)(local_bd8 + lVar15) != *(long **)((long)local_be8 + lVar15)) {
      operator_delete(*(long **)((long)local_be8 + lVar15),*(long *)(local_bd8 + lVar15) + 1);
    }
    if ((long *)((long)local_bf8 + lVar15) != *(long **)((long)local_c08 + lVar15)) {
      operator_delete(*(long **)((long)local_c08 + lVar15),*(long *)((long)local_bf8 + lVar15) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_c28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar15));
    if ((long *)((long)local_c38 + lVar15) != *(long **)((long)local_c48 + lVar15)) {
      operator_delete(*(long **)((long)local_c48 + lVar15),*(long *)((long)local_c38 + lVar15) + 1);
    }
    lVar15 = lVar15 + -0x88;
  } while (lVar15 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe7e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1500.m_cond._M_dataplus._M_p != &local_1500.m_cond.field_2) {
    operator_delete(local_1500.m_cond._M_dataplus._M_p,
                    local_1500.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1500.m_description._M_dataplus._M_p != &local_1500.m_description.field_2) {
    operator_delete(local_1500.m_description._M_dataplus._M_p,
                    local_1500.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1500.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1500.m_key_name._M_dataplus._M_p != &local_1500.m_key_name.field_2) {
    operator_delete(local_1500.m_key_name._M_dataplus._M_p,
                    local_1500.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe7c8);
  if (local_1540[0] != local_1530) {
    operator_delete(local_1540[0],local_1530[0] + 1);
  }
  if (local_1520[0] != local_1510) {
    operator_delete(local_1520[0],local_1510[0] + 1);
  }
  if (local_1478[0] != local_1468) {
    operator_delete(local_1478[0],local_1468[0] + 1);
  }
  if (local_1458[0] != local_1448) {
    operator_delete(local_1458[0],local_1448[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_16e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd0.m_cond._M_dataplus._M_p != &local_cd0.m_cond.field_2) {
    operator_delete(local_cd0.m_cond._M_dataplus._M_p,
                    local_cd0.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd0.m_description._M_dataplus._M_p != &local_cd0.m_description.field_2) {
    operator_delete(local_cd0.m_description._M_dataplus._M_p,
                    local_cd0.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_cd0.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd0.m_key_name._M_dataplus._M_p != &local_cd0.m_key_name.field_2) {
    operator_delete(local_cd0.m_key_name._M_dataplus._M_p,
                    local_cd0.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_16f8);
  lVar15 = 0x2a8;
  do {
    if ((long *)(local_fc8 + lVar15) != *(long **)((long)local_fd8 + lVar15)) {
      operator_delete(*(long **)((long)local_fd8 + lVar15),*(long *)(local_fc8 + lVar15) + 1);
    }
    if ((long *)((long)local_fe8 + lVar15) != *(long **)((long)local_ff8 + lVar15)) {
      operator_delete(*(long **)((long)local_ff8 + lVar15),*(long *)((long)local_fe8 + lVar15) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_1018.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + lVar15));
    if ((long *)((long)local_1028 + lVar15) != *(long **)((long)local_1038 + lVar15)) {
      operator_delete(*(long **)((long)local_1038 + lVar15),*(long *)((long)local_1028 + lVar15) + 1
                     );
    }
    lVar15 = lVar15 + -0x88;
  } while (lVar15 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe808);
  if (local_1438[0] != local_1428) {
    operator_delete(local_1438[0],local_1428[0] + 1);
  }
  if (local_1418[0] != local_1408) {
    operator_delete(local_1418[0],local_1408[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1770);
  lVar15 = 0x198;
  do {
    if ((long *)(local_1260 + lVar15) != *(long **)((long)local_1270 + lVar15)) {
      operator_delete(*(long **)((long)local_1270 + lVar15),*(long *)(local_1260 + lVar15) + 1);
    }
    plVar12 = (long *)((long)local_1270 + lVar15 + -0x10);
    plVar3 = *(long **)((long)&local_1290._M_dataplus._M_p + lVar15);
    if (plVar12 != plVar3) {
      operator_delete(plVar3,*plVar12 + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_12b0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + lVar15));
    if ((long *)((long)local_12c0 + lVar15) != *(long **)((long)&local_12d0 + lVar15)) {
      operator_delete(*(long **)((long)&local_12d0 + lVar15),
                      *(long *)((long)local_12c0 + lVar15) + 1);
    }
    lVar15 = lVar15 + -0x88;
  } while (lVar15 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe840);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13b8.m_cond._M_dataplus._M_p != &local_13b8.m_cond.field_2) {
    operator_delete(local_13b8.m_cond._M_dataplus._M_p,
                    local_13b8.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13b8.m_description._M_dataplus._M_p != &local_13b8.m_description.field_2) {
    operator_delete(local_13b8.m_description._M_dataplus._M_p,
                    local_13b8.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_13b8.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13b8.m_key_name._M_dataplus._M_p != &local_13b8.m_key_name.field_2) {
    operator_delete(local_13b8.m_key_name._M_dataplus._M_p,
                    local_13b8.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe828);
  if (local_13f8[0] != local_13e8) {
    operator_delete(local_13f8[0],local_13e8[0] + 1);
  }
  if (local_13d8[0] != local_13c8) {
    operator_delete(local_13d8[0],local_13c8[0] + 1);
  }
  if (local_1330[0] != local_1320) {
    operator_delete(local_1330[0],local_1320[0] + 1);
  }
  if (local_1310[0] != local_1300) {
    operator_delete(local_1310[0],local_1300[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe858);
  if (local_12d0 != local_12c0) {
    operator_delete(local_12d0,local_12c0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f0._M_dataplus._M_p != &local_12f0.field_2) {
    operator_delete(local_12f0._M_dataplus._M_p,local_12f0.field_2._M_allocated_capacity + 1);
  }
  if (local_12b0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_12b0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + 0x10U)) {
    operator_delete(local_12b0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_12b0.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1788);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1290._M_dataplus._M_p != &local_1290.field_2) {
    operator_delete(local_1290._M_dataplus._M_p,local_1290.field_2._M_allocated_capacity + 1);
  }
  if (local_1270[0] != (pointer)local_1260) {
    operator_delete(local_1270[0],local_1260._0_8_ + 1);
  }
  if (local_10b8[0] != local_10a8) {
    operator_delete(local_10b8[0],local_10a8[0] + 1);
  }
  if (local_1098[0] != local_1088) {
    operator_delete(local_1098[0],local_1088[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1758);
  if (local_1078[0] != local_1068) {
    operator_delete(local_1078[0],local_1068[0] + 1);
  }
  if (local_1058[0] != local_1048) {
    operator_delete(local_1058[0],local_1048[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1738);
  if (local_1038[0] != local_1028) {
    operator_delete(local_1038[0],local_1028[0] + 1);
  }
  if (local_1018.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_1018.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + 0x10U)) {
    operator_delete(local_1018.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_1018.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1718);
  if (local_ff8[0] != local_fe8) {
    operator_delete(local_ff8[0],local_fe8[0] + 1);
  }
  if (local_fd8[0] != (pointer)local_fc8) {
    operator_delete(local_fd8[0],local_fc8._0_8_ + 1);
  }
  if (local_d10[0] != local_d00) {
    operator_delete(local_d10[0],local_d00[0] + 1);
  }
  if (local_cf0[0] != local_ce0) {
    operator_delete(local_cf0[0],local_ce0[0] + 1);
  }
  if (local_c48[0] != local_c38) {
    operator_delete(local_c48[0],local_c38[0] + 1);
  }
  if (local_c28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_c28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_c28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_c28.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_16c8);
  if (local_c08[0] != local_bf8) {
    operator_delete(local_c08[0],local_bf8[0] + 1);
  }
  if (local_be8[0] != (pointer)local_bd8) {
    operator_delete(local_be8[0],local_bd8._0_8_ + 1);
  }
  if (local_a30[0] != local_a20) {
    operator_delete(local_a30[0],local_a20[0] + 1);
  }
  if (local_a10[0] != local_a00) {
    operator_delete(local_a10[0],local_a00[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1658);
  lVar15 = 0x318;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_3b0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar15));
    plVar3 = *(long **)((long)&local_410 + lVar15 + 0x40);
    plVar12 = (long *)((long)&local_410 + lVar15 + 0x50);
    if (plVar12 != plVar3) {
      operator_delete(plVar3,*plVar12 + 1);
    }
    plVar12 = (long *)((long)&local_410 + lVar15 + 0x28);
    plVar3 = *(long **)((long)&local_410 + lVar15 + 0x18);
    if (plVar12 != plVar3) {
      operator_delete(plVar3,*plVar12 + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(local_460 + lVar15 + 8));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)(local_538 + lVar15 + 200));
    if ((long *)(local_538 + lVar15 + 0xb0) != *(long **)(local_538 + lVar15 + 0xa0)) {
      operator_delete(*(long **)(local_538 + lVar15 + 0xa0),*(long *)(local_538 + lVar15 + 0xb0) + 1
                     );
    }
    lVar15 = lVar15 + -0x108;
  } while (lVar15 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_940);
  if (local_960 != &local_950) {
    operator_delete(local_960,CONCAT71(uStack_94f,local_950) + 1);
  }
  if (local_900 != &local_8f0) {
    operator_delete(local_900,local_8f0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_920._M_dataplus._M_p != &local_920.field_2) {
    operator_delete(local_920._M_dataplus._M_p,local_920.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_868._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_8c0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_8c0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c0.val._M_dataplus._M_p != &local_8c0.val.field_2) {
    operator_delete(local_8c0.val._M_dataplus._M_p,
                    CONCAT71(local_8c0.val.field_2._M_allocated_capacity._1_7_,
                             local_8c0.val.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e0._M_dataplus._M_p != &local_8e0.field_2) {
    operator_delete(local_8e0._M_dataplus._M_p,local_8e0.field_2._M_allocated_capacity + 1);
  }
  if (local_808[0] != local_7f8) {
    operator_delete(local_808[0],local_7f8[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_7c0);
  if (local_7e0 != &local_7d0) {
    operator_delete(local_7e0,CONCAT71(uStack_7cf,local_7d0) + 1);
  }
  if (local_780 != &local_770) {
    operator_delete(local_780,local_770 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a0._M_dataplus._M_p != &local_7a0.field_2) {
    operator_delete(local_7a0._M_dataplus._M_p,local_7a0.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_6e8._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_740.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_740.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_740.val._M_dataplus._M_p != &local_740.val.field_2) {
    operator_delete(local_740.val._M_dataplus._M_p,
                    CONCAT71(local_740.val.field_2._M_allocated_capacity._1_7_,
                             local_740.val.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_760._M_dataplus._M_p != &local_760.field_2) {
    operator_delete(local_760._M_dataplus._M_p,local_760.field_2._M_allocated_capacity + 1);
  }
  if (local_688[0] != local_678) {
    operator_delete(local_688[0],local_678[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_640);
  if (local_660 != &local_650) {
    operator_delete(local_660,CONCAT71(uStack_64f,local_650) + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1670);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_450);
  if ((undefined1 *)local_538._200_8_ != local_460) {
    operator_delete((void *)local_538._200_8_,local_460._0_8_ + 1);
  }
  if ((undefined1 *)local_538._160_8_ != local_538 + 0xb0) {
    operator_delete((void *)local_538._160_8_,local_538._176_8_ + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)(local_538 + 0x40));
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)(local_538 + 0x28));
  if ((undefined1 *)local_538._0_8_ != local_538 + 0x10) {
    operator_delete((void *)local_538._0_8_,local_538._16_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_5f8);
  if (local_618 != &local_608) {
    operator_delete(local_618,CONCAT71(uStack_607,local_608) + 1);
  }
  if (local_5d8[0] != local_5c8) {
    operator_delete(local_5d8[0],local_5c8[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_5b8._M_first);
  if (local_558[0] != local_548) {
    operator_delete(local_558[0],local_548[0] + 1);
  }
  if (local_430[0] != local_420) {
    operator_delete(local_430[0],local_420[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_410._M_first);
  if (local_3b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_3b0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_3b0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_3b0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan submitpackage()
{
    return RPCHelpMan{"submitpackage",
        "Submit a package of raw transactions (serialized, hex-encoded) to local node.\n"
        "The package will be validated according to consensus and mempool policy rules. If any transaction passes, it will be accepted to mempool.\n"
        "This RPC is experimental and the interface may be unstable. Refer to doc/policy/packages.md for documentation on package policies.\n"
        "Warning: successful submission does not mean the transactions will propagate throughout the network.\n"
        ,
        {
            {"package", RPCArg::Type::ARR, RPCArg::Optional::NO, "An array of raw transactions.\n"
                "The package must solely consist of a child and its parents. None of the parents may depend on each other.\n"
                "The package must be topologically sorted, with the child being the last element in the array.",
                {
                    {"rawtx", RPCArg::Type::STR_HEX, RPCArg::Optional::OMITTED, ""},
                },
            },
            {"maxfeerate", RPCArg::Type::AMOUNT, RPCArg::Default{FormatMoney(DEFAULT_MAX_RAW_TX_FEE_RATE.GetFeePerK())},
             "Reject transactions whose fee rate is higher than the specified value, expressed in " + CURRENCY_UNIT +
                 "/kvB.\nFee rates larger than 1BTC/kvB are rejected.\nSet to 0 to accept any fee rate."},
            {"maxburnamount", RPCArg::Type::AMOUNT, RPCArg::Default{FormatMoney(DEFAULT_MAX_BURN_AMOUNT)},
             "Reject transactions with provably unspendable outputs (e.g. 'datacarrier' outputs that use the OP_RETURN opcode) greater than the specified value, expressed in " + CURRENCY_UNIT + ".\n"
             "If burning funds through unspendable outputs is desired, increase this value.\n"
             "This check is based on heuristics and does not guarantee spendability of outputs.\n"
            },
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::STR, "package_msg", "The transaction package result message. \"success\" indicates all transactions were accepted into or are already in the mempool."},
                {RPCResult::Type::OBJ_DYN, "tx-results", "transaction results keyed by wtxid",
                {
                    {RPCResult::Type::OBJ, "wtxid", "transaction wtxid", {
                        {RPCResult::Type::STR_HEX, "txid", "The transaction hash in hex"},
                        {RPCResult::Type::STR_HEX, "other-wtxid", /*optional=*/true, "The wtxid of a different transaction with the same txid but different witness found in the mempool. This means the submitted transaction was ignored."},
                        {RPCResult::Type::NUM, "vsize", /*optional=*/true, "Sigops-adjusted virtual transaction size."},
                        {RPCResult::Type::OBJ, "fees", /*optional=*/true, "Transaction fees", {
                            {RPCResult::Type::STR_AMOUNT, "base", "transaction fee in " + CURRENCY_UNIT},
                            {RPCResult::Type::STR_AMOUNT, "effective-feerate", /*optional=*/true, "if the transaction was not already in the mempool, the effective feerate in " + CURRENCY_UNIT + " per KvB. For example, the package feerate and/or feerate with modified fees from prioritisetransaction."},
                            {RPCResult::Type::ARR, "effective-includes", /*optional=*/true, "if effective-feerate is provided, the wtxids of the transactions whose fees and vsizes are included in effective-feerate.",
                                {{RPCResult::Type::STR_HEX, "", "transaction wtxid in hex"},
                            }},
                        }},
                        {RPCResult::Type::STR, "error", /*optional=*/true, "The transaction error string, if it was rejected by the mempool"},
                    }}
                }},
                {RPCResult::Type::ARR, "replaced-transactions", /*optional=*/true, "List of txids of replaced transactions",
                {
                    {RPCResult::Type::STR_HEX, "", "The transaction id"},
                }},
            },
        },
        RPCExamples{
            HelpExampleRpc("submitpackage", R"(["rawtx1", "rawtx2"])") +
            HelpExampleCli("submitpackage", R"('["rawtx1", "rawtx2"]')")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            const UniValue raw_transactions = request.params[0].get_array();
            if (raw_transactions.size() < 2 || raw_transactions.size() > MAX_PACKAGE_COUNT) {
                throw JSONRPCError(RPC_INVALID_PARAMETER,
                                   "Array must contain between 2 and " + ToString(MAX_PACKAGE_COUNT) + " transactions.");
            }

            // Fee check needs to be run with chainstate and package context
            const CFeeRate max_raw_tx_fee_rate{ParseFeeRate(self.Arg<UniValue>("maxfeerate"))};
            std::optional<CFeeRate> client_maxfeerate{max_raw_tx_fee_rate};
            // 0-value is special; it's mapped to no sanity check
            if (max_raw_tx_fee_rate == CFeeRate(0)) {
                client_maxfeerate = std::nullopt;
            }

            // Burn sanity check is run with no context
            const CAmount max_burn_amount = request.params[2].isNull() ? 0 : AmountFromValue(request.params[2]);

            std::vector<CTransactionRef> txns;
            txns.reserve(raw_transactions.size());
            for (const auto& rawtx : raw_transactions.getValues()) {
                CMutableTransaction mtx;
                if (!DecodeHexTx(mtx, rawtx.get_str())) {
                    throw JSONRPCError(RPC_DESERIALIZATION_ERROR,
                                       "TX decode failed: " + rawtx.get_str() + " Make sure the tx has at least one input.");
                }

                for (const auto& out : mtx.vout) {
                    if((out.scriptPubKey.IsUnspendable() || !out.scriptPubKey.HasValidOps()) && out.nValue > max_burn_amount) {
                        throw JSONRPCTransactionError(TransactionError::MAX_BURN_EXCEEDED);
                    }
                }

                txns.emplace_back(MakeTransactionRef(std::move(mtx)));
            }
            if (!IsChildWithParentsTree(txns)) {
                throw JSONRPCTransactionError(TransactionError::INVALID_PACKAGE, "package topology disallowed. not child-with-parents or parents depend on each other.");
            }

            NodeContext& node = EnsureAnyNodeContext(request.context);
            CTxMemPool& mempool = EnsureMemPool(node);
            Chainstate& chainstate = EnsureChainman(node).ActiveChainstate();
            const auto package_result = WITH_LOCK(::cs_main, return ProcessNewPackage(chainstate, mempool, txns, /*test_accept=*/ false, client_maxfeerate));

            std::string package_msg = "success";

            // First catch package-wide errors, continue if we can
            switch(package_result.m_state.GetResult()) {
                case PackageValidationResult::PCKG_RESULT_UNSET:
                {
                    // Belt-and-suspenders check; everything should be successful here
                    CHECK_NONFATAL(package_result.m_tx_results.size() == txns.size());
                    for (const auto& tx : txns) {
                        CHECK_NONFATAL(mempool.exists(GenTxid::Txid(tx->GetHash())));
                    }
                    break;
                }
                case PackageValidationResult::PCKG_MEMPOOL_ERROR:
                {
                    // This only happens with internal bug; user should stop and report
                    throw JSONRPCTransactionError(TransactionError::MEMPOOL_ERROR,
                        package_result.m_state.GetRejectReason());
                }
                case PackageValidationResult::PCKG_POLICY:
                case PackageValidationResult::PCKG_TX:
                {
                    // Package-wide error we want to return, but we also want to return individual responses
                    package_msg = package_result.m_state.ToString();
                    CHECK_NONFATAL(package_result.m_tx_results.size() == txns.size() ||
                            package_result.m_tx_results.empty());
                    break;
                }
            }

            size_t num_broadcast{0};
            for (const auto& tx : txns) {
                // We don't want to re-submit the txn for validation in BroadcastTransaction
                if (!mempool.exists(GenTxid::Txid(tx->GetHash()))) {
                    continue;
                }

                // We do not expect an error here; we are only broadcasting things already/still in mempool
                std::string err_string;
                const auto err = BroadcastTransaction(node, tx, err_string, /*max_tx_fee=*/0, /*relay=*/true, /*wait_callback=*/true);
                if (err != TransactionError::OK) {
                    throw JSONRPCTransactionError(err,
                        strprintf("transaction broadcast failed: %s (%d transactions were broadcast successfully)",
                            err_string, num_broadcast));
                }
                num_broadcast++;
            }

            UniValue rpc_result{UniValue::VOBJ};
            rpc_result.pushKV("package_msg", package_msg);
            UniValue tx_result_map{UniValue::VOBJ};
            std::set<uint256> replaced_txids;
            for (const auto& tx : txns) {
                UniValue result_inner{UniValue::VOBJ};
                result_inner.pushKV("txid", tx->GetHash().GetHex());
                auto it = package_result.m_tx_results.find(tx->GetWitnessHash());
                if (it == package_result.m_tx_results.end()) {
                    // No results, report error and continue
                    result_inner.pushKV("error", "unevaluated");
                    continue;
                }
                const auto& tx_result = it->second;
                switch(it->second.m_result_type) {
                case MempoolAcceptResult::ResultType::DIFFERENT_WITNESS:
                    result_inner.pushKV("other-wtxid", it->second.m_other_wtxid.value().GetHex());
                    break;
                case MempoolAcceptResult::ResultType::INVALID:
                    result_inner.pushKV("error", it->second.m_state.ToString());
                    break;
                case MempoolAcceptResult::ResultType::VALID:
                case MempoolAcceptResult::ResultType::MEMPOOL_ENTRY:
                    result_inner.pushKV("vsize", int64_t{it->second.m_vsize.value()});
                    UniValue fees(UniValue::VOBJ);
                    fees.pushKV("base", ValueFromAmount(it->second.m_base_fees.value()));
                    if (tx_result.m_result_type == MempoolAcceptResult::ResultType::VALID) {
                        // Effective feerate is not provided for MEMPOOL_ENTRY transactions even
                        // though modified fees is known, because it is unknown whether package
                        // feerate was used when it was originally submitted.
                        fees.pushKV("effective-feerate", ValueFromAmount(tx_result.m_effective_feerate.value().GetFeePerK()));
                        UniValue effective_includes_res(UniValue::VARR);
                        for (const auto& wtxid : tx_result.m_wtxids_fee_calculations.value()) {
                            effective_includes_res.push_back(wtxid.ToString());
                        }
                        fees.pushKV("effective-includes", std::move(effective_includes_res));
                    }
                    result_inner.pushKV("fees", std::move(fees));
                    for (const auto& ptx : it->second.m_replaced_transactions) {
                        replaced_txids.insert(ptx->GetHash());
                    }
                    break;
                }
                tx_result_map.pushKV(tx->GetWitnessHash().GetHex(), std::move(result_inner));
            }
            rpc_result.pushKV("tx-results", std::move(tx_result_map));
            UniValue replaced_list(UniValue::VARR);
            for (const uint256& hash : replaced_txids) replaced_list.push_back(hash.ToString());
            rpc_result.pushKV("replaced-transactions", std::move(replaced_list));
            return rpc_result;
        },
    };
}